

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,InlineCacheIndex inlineCacheIndex,bool isRootLoad)

{
  code *pcVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  ArenaAllocator *allocator;
  unsigned_long local_50;
  size_t inlineCacheOffset;
  size_t offset;
  undefined1 auStack_35 [2];
  OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  bool isRootLoad_local;
  InlineCacheIndex inlineCacheIndex_local;
  ArgSlot givenArgCount_local;
  RegSlot functionRegister_local;
  RegSlot returnValueRegister_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  layout.super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Function._0_1_ = isRootLoad
  ;
  layout._7_4_ = inlineCacheIndex;
  unique0x100001ea = givenArgCount;
  bVar3 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>
                    ((uint *)((long)&offset + 7),returnValueRegister);
  if ((((bVar3) &&
       (bVar3 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>
                          ((uint *)auStack_35,functionRegister), bVar3)) &&
      (bVar3 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_short>
                         ((unsigned_short *)((long)&offset + 5),stack0xffffffffffffffda), bVar3)) &&
     (bVar3 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>
                        (&layout.super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
                          Return,layout._7_4_), bVar3)) {
    uVar4 = Data::EncodeT<(Js::LayoutSize)2>
                      (&this->m_byteCodeData,op,(void *)((long)&offset + 5),0xe,this);
    inlineCacheOffset = (size_t)uVar4;
    if (((byte)layout.super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Function & 1)
        != 0) {
      uVar4 = Data::GetCurrentOffset(&this->m_byteCodeData);
      sVar2 = inlineCacheOffset;
      uVar5 = OpCodeUtil::EncodedSize(op,LargeLayout);
      if ((ulong)uVar4 != sVar2 + uVar5 + 0xe) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x490,
                                    "(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIWithICIndex<SizePolicy>))"
                                    ,
                                    "m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIWithICIndex<SizePolicy>)"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      sVar2 = inlineCacheOffset;
      uVar4 = OpCodeUtil::EncodedSize(op,LargeLayout);
      local_50 = sVar2 + uVar4 + 10;
      allocator = JsUtil::
                  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::GetAllocator(this->m_labelOffsets);
      SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::Prepend
                (&this->rootObjectLoadMethodInlineCacheOffsets,allocator,&local_50);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteCallIWithICIndex(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, InlineCacheIndex inlineCacheIndex, bool isRootLoad)
    {
        OpLayoutT_CallIWithICIndex<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount) && SizePolicy::Assign(layout.inlineCacheIndex, inlineCacheIndex))
        {
            size_t offset = m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);

            if (isRootLoad)
            {
                Assert(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIWithICIndex<SizePolicy>));
                size_t inlineCacheOffset = offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum)
                    + offsetof(OpLayoutT_CallIWithICIndex<SizePolicy>, inlineCacheIndex);

                rootObjectLoadMethodInlineCacheOffsets.Prepend(m_labelOffsets->GetAllocator(), inlineCacheOffset);
            }
            return true;
        }
        return false;
    }